

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

Value * duckdb::NumericStats::Max(Value *__return_storage_ptr__,BaseStatistics *stats)

{
  InternalException *this;
  string local_40;
  
  if (((stats->type).id_ != SQLNULL) && (((stats->stats_union).string_data.min[1] & 1) != 0)) {
    NumericValueUnionToValue
              (__return_storage_ptr__,&stats->type,&(stats->stats_union).numeric_data.max);
    return __return_storage_ptr__;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Max() called on statistics that does not have max","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool NumericStats::HasMax(const BaseStatistics &stats) {
	if (stats.GetType().id() == LogicalTypeId::SQLNULL) {
		return false;
	}
	return NumericStats::GetDataUnsafe(stats).has_max;
}